

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O3

void __thiscall Am_Drawonable_Impl::Set_Visible(Am_Drawonable_Impl *this,bool vis)

{
  if (this->offscreen != false) {
    return;
  }
  (this->super_Am_Drawonable).visible = vis;
  if (vis) {
    this->expect_map_change = true;
    XMapWindow(this->screen->display,this->xlib_drawable);
    (*(this->super_Am_Drawonable)._vptr_Am_Drawonable[0x14])(this);
    return;
  }
  Unmap_And_Wait(this);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Set_Visible(bool vis)
{
  if (offscreen)
    return; // not meaningful for offscreen pixmap
  visible = vis;

  if (vis)
    //    Map_And_Wait((ask_position == false) && (ask_size == false));
    Map_And_Wait(false);
  else
    Unmap_And_Wait();
}